

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O3

ostream * operator<<(ostream *os,S1ChordAngle a)

{
  ostream *poVar1;
  double dVar2;
  S1Angle a_00;
  
  if (0.0 <= a.length2_) {
    a_00.radians_ = INFINITY;
    if (a.length2_ < INFINITY) {
      if (a.length2_ < 0.0) {
        dVar2 = sqrt(a.length2_);
      }
      else {
        dVar2 = SQRT(a.length2_);
      }
      dVar2 = asin(dVar2 * 0.5);
      a_00.radians_ = dVar2 + dVar2;
    }
  }
  else {
    a_00.radians_ = -1.0;
  }
  poVar1 = operator<<(os,a_00);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, S1ChordAngle a) {
  return os << a.ToAngle();
}